

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O0

void __thiscall
ot::commissioner::FileLogger::Log(FileLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  ostream *poVar1;
  char *__s;
  undefined1 extraout_DL;
  LogLevel aLevel_00;
  undefined7 extraout_var;
  string local_230 [32];
  string local_210;
  undefined8 local_1f0;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream logStream;
  ostream local_1a8 [376];
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> _;
  string *aMsg_local;
  string *aRegion_local;
  LogLevel aLevel_local;
  FileLogger *this_local;
  
  _._M_device = (mutex_type *)aMsg;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mLogMutex);
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((aLevel <= this->mLogLevel) && (this->mLogFile != (FILE *)0x0)) {
    poVar1 = std::operator<<(local_1a8,"[ ");
    local_1f0 = std::chrono::_V2::system_clock::now();
    TimePointToString_abi_cxx11_
              (&local_1e8,(commissioner *)&local_1f0,(TimePoint *)CONCAT71(extraout_var,extraout_DL)
              );
    poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
    poVar1 = std::operator<<(poVar1," ] ");
    ToString_abi_cxx11_(&local_210,(commissioner *)(ulong)aLevel,aLevel_00);
    poVar1 = std::operator<<(poVar1,(string *)&local_210);
    poVar1 = std::operator<<(poVar1," [ ");
    poVar1 = std::operator<<(poVar1,(string *)aRegion);
    poVar1 = std::operator<<(poVar1," ] ");
    poVar1 = std::operator<<(poVar1,(string *)_._M_device);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringstream::str();
    __s = (char *)std::__cxx11::string::c_str();
    fputs(__s,(FILE *)this->mLogFile);
    std::__cxx11::string::~string(local_230);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void FileLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    std::lock_guard<std::mutex> _(mLogMutex);
    std::stringstream           logStream;

    VerifyOrExit(aLevel <= mLogLevel);
    VerifyOrExit(mLogFile != nullptr);

    logStream << "[ " << TimePointToString(Clock::now()) << " ] " << ToString(aLevel) << " [ " << aRegion << " ] "
              << aMsg << std::endl;
    fputs(logStream.str().c_str(), mLogFile);

exit:
    return;
}